

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O1

ion_err_t linear_hash_increment_num_records(linear_hash_table_t *linear_hash)

{
  int iVar1;
  ion_err_t iVar2;
  int iVar3;
  
  iVar3 = linear_hash->num_records + 1;
  linear_hash->num_records = iVar3;
  if ((double)linear_hash->split_threshold <
      (double)(iVar3 * 100) / (double)(linear_hash->records_per_bucket * linear_hash->num_buckets))
  {
    iVar2 = write_new_bucket(linear_hash->num_buckets,linear_hash);
    if (iVar2 == '\0') {
      iVar3 = linear_hash->num_buckets;
      linear_hash->num_buckets = iVar3 + 1;
      iVar1 = linear_hash->initial_size * 2;
      if (iVar3 == iVar1) {
        linear_hash->initial_size = iVar1;
        linear_hash->next_split = 0;
      }
      iVar2 = split(linear_hash);
      return iVar2;
    }
  }
  else {
    iVar2 = '\0';
  }
  return iVar2;
}

Assistant:

ion_err_t
linear_hash_increment_num_records(
	linear_hash_table_t *linear_hash
) {
	linear_hash->num_records++;

	ion_err_t err = err_ok;

	if (linear_hash_above_threshold(linear_hash)) {
		err = write_new_bucket(linear_hash->num_buckets, linear_hash);

		if (err != err_ok) {
			return err;
		}

		linear_hash_increment_num_buckets(linear_hash);
		err = split(linear_hash);
	}

	return err;
}